

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O2

ssize_t __thiscall amrex::FABio_ascii::read(FABio_ascii *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  ssize_t extraout_RAX;
  int k;
  long lVar4;
  undefined4 in_register_00000034;
  istream *is;
  IntVect local_58;
  int local_48;
  int local_44;
  int local_40;
  IntVect q;
  
  is = (istream *)CONCAT44(in_register_00000034,__fd);
  local_48 = *(int *)((long)__buf + 0x24);
  local_44 = *(int *)((long)__buf + 0x28);
  local_40 = *(int *)((long)__buf + 0x2c);
  q.vect[0] = 0;
  q.vect[1] = 0;
  q.vect[2] = 0;
  local_58.vect._0_8_ = *(undefined8 *)((long)__buf + 0x18);
  local_58.vect[2] = *(int *)((long)__buf + 0x20);
  while ((local_58.vect[2] <= local_40 &&
         ((local_40 != local_58.vect[2] ||
          ((local_58.vect[1] <= local_44 &&
           ((local_44 != local_58.vect[1] || (local_58.vect[0] <= local_48))))))))) {
    amrex::operator>>(is,&q);
    if (((local_58.vect[0] != q.vect[0]) || (local_58.vect[1] != q.vect[1])) ||
       (local_58.vect[2] != q.vect[2])) {
      poVar3 = ErrorStream();
      poVar3 = std::operator<<(poVar3,"Error: read IntVect ");
      poVar3 = amrex::operator<<(poVar3,&q);
      poVar3 = std::operator<<(poVar3,"  should be ");
      poVar3 = amrex::operator<<(poVar3,&local_58);
      std::operator<<(poVar3,'\n');
      Error_host("FABio_ascii::read() bad IntVect");
    }
    for (lVar4 = 0; lVar4 < *(int *)((long)__buf + 0x34); lVar4 = lVar4 + 1) {
      Box::numPts((Box *)((long)__buf + 0x18));
      std::istream::_M_extract<double>((double *)is);
    }
    iVar1 = local_58.vect[0];
    iVar2 = local_58.vect[1];
    local_58.vect[0] = local_58.vect[0] + 1;
    if (*(int *)((long)__buf + 0x24) <= iVar1) {
      local_58.vect[1] = local_58.vect[1] + 1;
      local_58.vect[0] = *(int *)((long)__buf + 0x18);
      if (*(int *)((long)__buf + 0x28) <= iVar2) {
        local_58.vect[1] = *(int *)((long)__buf + 0x1c);
        local_58.vect[2] = local_58.vect[2] + 1;
      }
    }
  }
  lVar4 = *(long *)(*(long *)is + -0x18);
  if (((byte)is[lVar4 + 0x20] & 5) != 0) {
    Error_host("FABio_ascii::read() failed");
    lVar4 = extraout_RAX;
  }
  return lVar4;
}

Assistant:

void
FABio_ascii::read (std::istream& is,
                   FArrayBox&    f) const
{
    const Box& bx = f.box();

    IntVect sm = bx.smallEnd();
    IntVect bg = bx.bigEnd();
    IntVect p, q;
    for(p = sm; p <= bg; bx.next(p)) {
        is >> q;
        if(p != q) {
          amrex::ErrorStream() << "Error: read IntVect "
                    << q
                    << "  should be "
                    << p
                    << '\n';
          amrex::Error("FABio_ascii::read() bad IntVect");
        }
        for(int k(0); k < f.nComp(); ++k) {
            is >> f(p, k);
        }
    }

    if(is.fail()) {
        amrex::Error("FABio_ascii::read() failed");
    }
}